

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::BatchNorm_x86_avx2::forward_inplace(BatchNorm_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  _func_int **pp_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [16];
  uint uVar14;
  int iVar15;
  _func_int *p_Var16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  iVar8 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar8 == 2) {
      iVar10 = bottom_top_blob->h;
      if ((long)iVar10 < 1) {
        return 0;
      }
      iVar15 = bottom_top_blob->w;
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        if (0 < iVar15) {
          auVar25 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11 * 0x10);
          auVar26 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11 * 0x10);
          pauVar13 = (undefined1 (*) [16])
                     (bottom_top_blob->w * lVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar18 = iVar15;
          do {
            auVar7 = vfmadd132ps_fma(*pauVar13,auVar25,auVar26);
            *pauVar13 = auVar7;
            pauVar13 = pauVar13 + 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar10);
    }
    else if (iVar8 == 1) {
      iVar10 = bottom_top_blob->w;
      if ((long)iVar10 < 1) {
        return 0;
      }
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)bottom_top_blob->data + lVar11),
                                  *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11),
                                  *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11));
        *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar11) = auVar25;
        lVar11 = lVar11 + 0x10;
      } while ((long)iVar10 * 0x10 != lVar11);
    }
    if ((iVar8 - 3U < 2) && (iVar8 = bottom_top_blob->c, 0 < (long)iVar8)) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        if (0 < iVar10) {
          auVar25 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11 * 0x10);
          auVar26 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11 * 0x10);
          pauVar13 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            auVar7 = vfmadd132ps_fma(*pauVar13,auVar25,auVar26);
            *pauVar13 = auVar7;
            pauVar13 = pauVar13 + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar8);
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar8 == 2) {
      iVar10 = bottom_top_blob->h;
      if ((long)iVar10 < 1) {
        return 0;
      }
      iVar15 = bottom_top_blob->w;
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        if (0 < iVar15) {
          auVar3 = *(undefined1 (*) [32])
                    (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11 * 0x20);
          auVar4 = *(undefined1 (*) [32])
                    (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11 * 0x20);
          pauVar12 = (undefined1 (*) [32])
                     (bottom_top_blob->w * lVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar18 = iVar15;
          do {
            auVar25 = vfmadd132ps_fma(*pauVar12,auVar3,auVar4);
            *pauVar12 = ZEXT1632(auVar25);
            pauVar12 = pauVar12 + 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar10);
    }
    else if (iVar8 == 1) {
      iVar10 = bottom_top_blob->w;
      if ((long)iVar10 < 1) {
        return 0;
      }
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)bottom_top_blob->data + lVar11),
                                  *(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11),
                                  *(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11));
        *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar11) = ZEXT1632(auVar25);
        lVar11 = lVar11 + 0x20;
      } while ((long)iVar10 * 0x20 != lVar11);
    }
    if ((iVar8 - 3U < 2) && (iVar8 = bottom_top_blob->c, 0 < (long)iVar8)) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
      lVar11 = 0;
      do {
        if (0 < iVar10) {
          auVar3 = *(undefined1 (*) [32])
                    (*(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]) + lVar11 * 0x20);
          auVar4 = *(undefined1 (*) [32])
                    (*(long *)(&this->field_0x240 + (long)pp_Var5[-3]) + lVar11 * 0x20);
          pauVar12 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            auVar25 = vfmadd132ps_fma(*pauVar12,auVar3,auVar4);
            *pauVar12 = ZEXT1632(auVar25);
            pauVar12 = pauVar12 + 1;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar8);
    }
  }
  else {
    if (iVar8 - 5U < 0xfffffffe) {
      iVar8 = BatchNorm::forward_inplace
                        ((BatchNorm *)
                         ((long)&this->_vptr_BatchNorm_x86_avx2 +
                         (long)this->_vptr_BatchNorm_x86_avx2[-3]),bottom_top_blob,opt);
      return iVar8;
    }
    pp_Var5 = this->_vptr_BatchNorm_x86_avx2;
    p_Var16 = pp_Var5[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var16)) {
      uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      lVar11 = 0;
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar20._8_8_ = 0x8000000000000000;
      auVar20._0_8_ = 0x8000000000000000;
      auVar20._16_8_ = 0x8000000000000000;
      auVar20._24_8_ = 0x8000000000000000;
      auVar3 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
      do {
        pauVar12 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar1 = *(undefined4 *)(*(long *)(&this->field_0x1f8 + (long)p_Var16) + lVar11 * 4);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        uVar2 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var16) + lVar11 * 4);
        auVar23._4_4_ = uVar2;
        auVar23._0_4_ = uVar2;
        auVar23._8_4_ = uVar2;
        auVar23._12_4_ = uVar2;
        auVar23._16_4_ = uVar2;
        auVar23._20_4_ = uVar2;
        auVar23._24_4_ = uVar2;
        auVar23._28_4_ = uVar2;
        if ((int)uVar9 < 8) {
          uVar17 = 0;
        }
        else {
          iVar8 = 7;
          do {
            auVar25 = vfmadd132ps_fma(*pauVar12,auVar21,auVar23);
            *pauVar12 = ZEXT1632(auVar25);
            pauVar12 = pauVar12 + 1;
            iVar8 = iVar8 + 8;
            uVar17 = uVar9 & 0xfffffff8;
          } while (iVar8 < (int)uVar9);
        }
        if ((int)(uVar17 | 3) < (int)uVar9) {
          auVar25._4_4_ = uVar1;
          auVar25._0_4_ = uVar1;
          auVar25._8_4_ = uVar1;
          auVar25._12_4_ = uVar1;
          auVar26._4_4_ = uVar2;
          auVar26._0_4_ = uVar2;
          auVar26._8_4_ = uVar2;
          auVar26._12_4_ = uVar2;
          uVar14 = uVar17;
          do {
            auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar12,auVar25,auVar26);
            *(undefined1 (*) [16])*pauVar12 = auVar7;
            pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
            uVar17 = uVar14 + 4;
            iVar8 = uVar14 + 7;
            uVar14 = uVar17;
          } while (iVar8 < (int)uVar9);
        }
        if ((int)uVar17 < (int)uVar9) {
          uVar17 = ~uVar17 + uVar9;
          auVar28._8_4_ = uVar17;
          auVar28._0_8_ = CONCAT44(0,uVar17);
          auVar28._12_4_ = 0;
          auVar28._16_4_ = uVar17;
          auVar28._20_4_ = 0;
          auVar28._24_4_ = uVar17;
          auVar28._28_4_ = 0;
          auVar24._4_4_ = uVar2;
          auVar24._0_4_ = uVar2;
          auVar24._8_4_ = uVar2;
          auVar24._12_4_ = uVar2;
          auVar24._16_4_ = uVar2;
          auVar24._20_4_ = uVar2;
          auVar24._24_4_ = uVar2;
          auVar24._28_4_ = uVar2;
          auVar22._4_4_ = uVar1;
          auVar22._0_4_ = uVar1;
          auVar22._8_4_ = uVar1;
          auVar22._12_4_ = uVar1;
          auVar22._16_4_ = uVar1;
          auVar22._20_4_ = uVar1;
          auVar22._24_4_ = uVar1;
          auVar22._28_4_ = uVar1;
          auVar21 = vpor_avx2(auVar28,auVar20);
          uVar19 = 0;
          do {
            auVar27._8_8_ = uVar19;
            auVar27._0_8_ = uVar19;
            auVar27._16_8_ = uVar19;
            auVar27._24_8_ = uVar19;
            auVar28 = vpor_avx2(auVar27,auVar4);
            auVar23 = vpor_avx2(auVar27,auVar6);
            auVar23 = vpcmpgtq_avx2(auVar23 ^ auVar20,auVar21);
            auVar28 = vpcmpgtq_avx2(auVar28 ^ auVar20,auVar21);
            auVar23 = vpackssdw_avx2(auVar28,auVar23);
            auVar25 = vpackssdw_avx(SUB3216(auVar23 ^ auVar3,0),SUB3216(auVar23 ^ auVar3,0x10));
            auVar25 = vpshufd_avx(auVar25,0xd8);
            auVar23 = vpmovzxwd_avx2(auVar25);
            auVar28 = vpslld_avx2(auVar23,0x1f);
            auVar23 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(*pauVar12 + uVar19 * 4));
            auVar25 = vfmadd213ps_fma(auVar23,auVar24,auVar22);
            auVar23 = vmaskmovps_avx(auVar28,ZEXT1632(auVar25));
            *(undefined1 (*) [32])(*pauVar12 + uVar19 * 4) = auVar23;
            uVar19 = uVar19 + 8;
          } while ((CONCAT44(0,uVar17) + 8 & 0xfffffffffffffff8) != uVar19);
        }
        lVar11 = lVar11 + 1;
        p_Var16 = pp_Var5[-3];
      } while (lVar11 < *(int *)(&this->field_0xd0 + (long)p_Var16));
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}